

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

Aig_Obj_t * Cgt_ManBuildClockGate(Aig_Man_t *pNew,Vec_Ptr_t *vGates)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  int i;
  Aig_Obj_t *p0;
  
  iVar1 = vGates->nSize;
  if (0 < iVar1) {
    p0 = (Aig_Obj_t *)((ulong)pNew->pConst1 ^ 1);
    for (i = 0; i < iVar1; i = i + 1) {
      pvVar2 = Vec_PtrEntry(vGates,i);
      uVar3 = *(ulong *)((ulong)pvVar2 & 0xfffffffffffffffe);
      if (uVar3 == 0) {
        uVar3 = ((ulong *)((ulong)pvVar2 & 0xfffffffffffffffe))[5];
      }
      p0 = Aig_Or(pNew,p0,(Aig_Obj_t *)((uint)pvVar2 & 1 ^ uVar3));
      iVar1 = vGates->nSize;
    }
    return p0;
  }
  __assert_fail("Vec_PtrSize(vGates) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                ,500,"Aig_Obj_t *Cgt_ManBuildClockGate(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t * Cgt_ManBuildClockGate( Aig_Man_t * pNew, Vec_Ptr_t * vGates )
{
    Aig_Obj_t * pGate, * pTotal;
    int i;
    assert( Vec_PtrSize(vGates) > 0 );
    pTotal = Aig_ManConst0(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vGates, pGate, i )
    {
        if ( Aig_Regular(pGate)->pNext )
            pGate = Aig_NotCond( Aig_Regular(pGate)->pNext, Aig_IsComplement(pGate) );
        else
            pGate = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pGate)->pData, Aig_IsComplement(pGate) );
        pTotal = Aig_Or( pNew, pTotal, pGate );
    }
    return pTotal;
}